

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve.cpp
# Opt level: O2

void __thiscall Curve::findSegment(Curve *this,double xseg,double *slope,double *intercept)

{
  double *pdVar1;
  pointer pdVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  double dVar6;
  
  pdVar1 = (this->xData).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar4 = (int)((ulong)((long)(this->xData).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1) >> 3);
  if (iVar4 == 1) {
    *intercept = 0.0;
    dVar6 = *pdVar1;
    if ((dVar6 != 0.0) || (NAN(dVar6))) {
      *slope = *(this->yData).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start / dVar6;
    }
    else {
      *slope = 0.0;
    }
  }
  else {
    iVar3 = iVar4 + -1;
    for (lVar5 = 1; lVar5 < iVar4; lVar5 = lVar5 + 1) {
      if (xseg <= pdVar1[lVar5]) {
        iVar3 = (int)lVar5;
        break;
      }
    }
    lVar5 = (long)iVar3;
    pdVar2 = (this->yData).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar6 = (pdVar2[lVar5] - pdVar2[lVar5 + -1]) / (pdVar1[lVar5] - pdVar1[lVar5 + -1]);
    *slope = dVar6;
    *intercept = pdVar2[lVar5] - dVar6 * pdVar1[lVar5];
  }
  return;
}

Assistant:

void Curve::findSegment(double xseg, double& slope, double& intercept)
{
    int n = xData.size();
    int segment = n-1;

    if (n == 1)
    {
        intercept = 0.0;
        if (xData[0] == 0.0) slope = 0.0;
        else slope = yData[0] / xData[0];
    }

    else
    {
        for (int i = 1; i < n; i++)
        {
            if (xseg <= xData[i])
            {
                segment = i;
                break;
            }
        }
        slope = (yData[segment] - yData[segment-1]) /
                (xData[segment] - xData[segment-1]);
        intercept = yData[segment] - slope * xData[segment];
    }
}